

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::MakeNewCluster(Segment *this,uint64_t frame_timestamp_ns)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  long *plVar6;
  void *pvVar7;
  uint64_t in_RSI;
  long in_RDI;
  int64_t offset;
  Cluster **cluster;
  uint64_t tc;
  uint64_t ns;
  Frame *f;
  uint64_t cluster_timecode;
  uint64_t frame_timecode;
  uint64_t timecode_scale;
  Cluster *old_cluster;
  int32_t i;
  Cluster **clusters;
  int32_t new_capacity;
  int32_t new_size;
  MkvWriter *in_stack_ffffffffffffff30;
  MkvWriter *in_stack_ffffffffffffff38;
  Segment *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined2 uVar8;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int iVar9;
  uint64_t in_stack_ffffffffffffff68;
  Cluster *in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff80;
  Segment *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  Segment *in_stack_ffffffffffffffa8;
  int local_2c;
  long lVar10;
  undefined1 set_last_frame_duration;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar8 = (undefined2)((ulong)in_stack_ffffffffffffff50 >> 0x30);
  iVar3 = *(int *)(in_RDI + 0x114) + 1;
  lVar10 = in_RDI;
  if (*(int *)(in_RDI + 0x110) < iVar3) {
    if (*(int *)(in_RDI + 0x110) < 1) {
      iVar9 = 1;
    }
    else {
      iVar9 = *(int *)(in_RDI + 0x110) << 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar9;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    in_stack_ffffffffffffff5c = iVar9;
    pvVar5 = operator_new__(uVar4,(nothrow_t *)&std::nothrow);
    if (pvVar5 == (void *)0x0) {
      return false;
    }
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x114); local_2c = local_2c + 1) {
      *(undefined8 *)((long)pvVar5 + (long)local_2c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x108) + (long)local_2c * 8);
    }
    pvVar7 = *(void **)(in_RDI + 0x108);
    if (pvVar7 != (void *)0x0) {
      operator_delete__(pvVar7);
    }
    uVar8 = (undefined2)((ulong)pvVar7 >> 0x30);
    *(void **)(in_RDI + 0x108) = pvVar5;
    *(int *)(in_RDI + 0x110) = iVar9;
  }
  set_last_frame_duration = (undefined1)((ulong)lVar10 >> 0x38);
  bVar2 = WriteFramesLessThan(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (bVar2) {
    if ((*(int *)(in_RDI + 0x114) < 1) ||
       ((*(long *)(*(long *)(in_RDI + 0x108) + (long)(*(int *)(in_RDI + 0x114) + -1) * 8) != 0 &&
        (bVar2 = Cluster::Finalize((Cluster *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                   (bool)set_last_frame_duration,in_RSI), bVar2)))) {
      if ((*(byte *)(in_RDI + 0x94d) & 1) != 0) {
        *(undefined1 *)(in_RDI + 0x94c) = 1;
      }
      if (((*(byte *)(in_RDI + 0xf0) & 1) != 0) && (0 < *(int *)(in_RDI + 0x114))) {
        MkvWriter::Close(in_stack_ffffffffffffff30);
        *(int *)(in_RDI + 200) = *(int *)(in_RDI + 200) + 1;
        bVar2 = UpdateChunkName(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                in_stack_ffffffffffffff98);
        if (!bVar2) {
          return false;
        }
        bVar2 = MkvWriter::Open(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
        if (!bVar2) {
          return false;
        }
      }
      SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0x68));
      if (0 < *(int *)(in_RDI + 0x13c)) {
        Frame::timestamp((Frame *)**(undefined8 **)(in_RDI + 0x130));
      }
      plVar6 = (long *)(*(long *)(in_RDI + 0x108) + (long)*(int *)(in_RDI + 0x114) * 8);
      MaxOffset(in_stack_ffffffffffffff48);
      pvVar7 = operator_new(0xa0,(nothrow_t *)&std::nothrow);
      pvVar5 = (void *)0x0;
      if (pvVar7 != (void *)0x0) {
        SegmentInfo::timecode_scale((SegmentInfo *)(in_RDI + 0x68));
        Cluster::Cluster(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI,
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
        pvVar5 = pvVar7;
      }
      *plVar6 = (long)pvVar5;
      if (*plVar6 == 0) {
        bVar2 = false;
      }
      else {
        bVar2 = Cluster::Init((Cluster *)*plVar6,*(IMkvWriter **)(in_RDI + 0x978));
        if (bVar2) {
          *(int *)(in_RDI + 0x114) = iVar3;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Segment::MakeNewCluster(uint64_t frame_timestamp_ns) {
  const int32_t new_size = cluster_list_size_ + 1;

  if (new_size > cluster_list_capacity_) {
    // Add more clusters.
    const int32_t new_capacity =
        (cluster_list_capacity_ <= 0) ? 1 : cluster_list_capacity_ * 2;
    Cluster** const clusters =
        new (std::nothrow) Cluster*[new_capacity];  // NOLINT
    if (!clusters)
      return false;

    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      clusters[i] = cluster_list_[i];
    }

    delete[] cluster_list_;

    cluster_list_ = clusters;
    cluster_list_capacity_ = new_capacity;
  }

  if (!WriteFramesLessThan(frame_timestamp_ns))
    return false;

  if (cluster_list_size_ > 0) {
    // Update old cluster's size
    Cluster* const old_cluster = cluster_list_[cluster_list_size_ - 1];

    if (!old_cluster || !old_cluster->Finalize(true, frame_timestamp_ns))
      return false;
  }

  if (output_cues_)
    new_cuepoint_ = true;

  if (chunking_ && cluster_list_size_ > 0) {
    chunk_writer_cluster_->Close();
    chunk_count_++;

    if (!UpdateChunkName("chk", &chunk_name_))
      return false;
    if (!chunk_writer_cluster_->Open(chunk_name_))
      return false;
  }

  const uint64_t timecode_scale = segment_info_.timecode_scale();
  const uint64_t frame_timecode = frame_timestamp_ns / timecode_scale;

  uint64_t cluster_timecode = frame_timecode;

  if (frames_size_ > 0) {
    const Frame* const f = frames_[0];  // earliest queued frame
    const uint64_t ns = f->timestamp();
    const uint64_t tc = ns / timecode_scale;

    if (tc < cluster_timecode)
      cluster_timecode = tc;
  }

  Cluster*& cluster = cluster_list_[cluster_list_size_];
  const int64_t offset = MaxOffset();
  cluster = new (std::nothrow)
      Cluster(cluster_timecode, offset, segment_info_.timecode_scale(),
              accurate_cluster_duration_, fixed_size_cluster_timecode_);
  if (!cluster)
    return false;

  if (!cluster->Init(writer_cluster_))
    return false;

  cluster_list_size_ = new_size;
  return true;
}